

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

double helicsInputGetDouble(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  double val;
  double local_10;
  
  pIVar1 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  if (pIVar1 == (InputObject *)0x0) {
    local_10 = -1e+49;
  }
  else {
    helics::Input::getValue_impl<double>(pIVar1->inputPtr,&local_10);
  }
  return local_10;
}

Assistant:

double helicsInputGetDouble(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_INVALID_DOUBLE;
    }
    try {
        return inpObj->inputPtr->getValue<double>();
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_INVALID_DOUBLE;
    }
}